

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gausschebyshev1.hpp
# Opt level: O0

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
IntegratorXX::quadrature_traits<IntegratorXX::GaussChebyshev1<double,_double>,_void>::generate
          (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,size_t npts)

{
  pointer __n;
  long lVar1;
  reference pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  weight_type wi;
  double xi;
  double ti;
  size_t i;
  size_t idx;
  weight_type pi_ov_2npts;
  weight_type pi_ov_npts;
  undefined1 local_60 [8];
  weight_container weights;
  allocator<double> local_31;
  undefined1 local_30 [8];
  point_container points;
  size_t npts_local;
  
  points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)npts;
  std::allocator<double>::allocator(&local_31);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,npts,&local_31);
  std::allocator<double>::~allocator(&local_31);
  __n = points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  std::allocator<double>::allocator((allocator<double> *)((long)&pi_ov_npts + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,(size_type)__n,
             (allocator<double> *)((long)&pi_ov_npts + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&pi_ov_npts + 7));
  auVar7._8_4_ = (int)((ulong)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage >> 0x20);
  auVar7._0_8_ = points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  auVar7._12_4_ = 0x45300000;
  dVar3 = 3.141592653589793 /
          ((auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,
                            (int)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage) - 4503599627370496.0));
  for (i = 0; i < (ulong)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage >> 1; i = i + 1) {
    lVar1 = (long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage - i;
    auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar6._0_8_ = lVar1;
    auVar6._12_4_ = 0x45300000;
    dVar4 = (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
    dVar4 = cos((dVar4 + dVar4 + -1.0) * (dVar3 / 2.0));
    dVar5 = sqrt(-dVar4 * dVar4 + 1.0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,i);
    *pvVar2 = dVar4;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_60,i);
    *pvVar2 = dVar5 * dVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,lVar1 - 1);
    *pvVar2 = -dVar4;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_60,lVar1 - 1);
    *pvVar2 = dVar5 * dVar3;
  }
  if (((ulong)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,
                        (ulong)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage >> 1);
    *pvVar2 = 0.0;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_60,
                        (ulong)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage >> 1);
    *pvVar2 = dVar3;
  }
  std::
  make_tuple<std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&>
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_30,
             (vector<double,_std::allocator<double>_> *)local_60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container, weight_container> generate(size_t npts) {
    point_container points(npts);
    weight_container weights(npts);

    const weight_type pi_ov_npts = M_PI / npts;
    const weight_type pi_ov_2npts = pi_ov_npts / 2;

    // Generate the first half explicitly and reflect
    for(size_t idx = 0; idx < npts/2; ++idx) {
      // Transform index here for two reasons: the mathematical
      // equations are for 1 <= i <= n, and the nodes are generated in
      // decreasing order. This generates them in the right order
      size_t i = npts - idx;

      // The standard nodes and weights are given by
      const auto ti = (2.0 * i - 1.0) * pi_ov_2npts;
      const auto xi = std::cos(ti);
      auto wi = pi_ov_npts;

      // However, as we're integrating f(x) not \frac{f(x)}{\sqrt{1 -
      // x^2}}, we must factor the \sqrt{1-x^2} into the weight
      wi *= std::sqrt(1.0 - xi * xi);

      // Store into memory
      points[idx]  = xi;
      weights[idx] = wi;

      // Reflect to second half
      points[i-1]  = -xi;
      weights[i-1] = wi; 
    }

    // Edge case for odd points
    if(npts % 2) {
      points[npts/2]  = 0.0;
      weights[npts/2] = pi_ov_npts;
    }


    return std::make_tuple(points, weights);
  }